

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CatalogReader.hpp
# Opt level: O2

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
* __thiscall
CatalogReader::createCourseHeirarchy_abi_cxx11_
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
           *__return_storage_ptr__,CatalogReader *this)

{
  pointer pbVar1;
  ostream *poVar2;
  mapped_type *ppCVar3;
  long *plVar4;
  undefined8 *puVar5;
  pointer pbVar6;
  CourseComponent *temp;
  CourseComponent *course;
  vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *cList;
  undefined *local_3f0;
  pointer local_3e8;
  pointer local_3e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prereqs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c0;
  string local_3a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> required;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
  courses;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  string local_258;
  ifstream fin;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&courses,
                 &this->resourcesPath,&this->resourceExtension);
  std::ifstream::ifstream(&fin,(string *)&courses,_S_in);
  std::__cxx11::string::~string((string *)&courses);
  courses._M_h._M_buckets = &courses._M_h._M_single_bucket;
  courses._M_h._M_bucket_count = 1;
  courses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  courses._M_h._M_element_count = 0;
  courses._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  courses._M_h._M_rehash_policy._M_next_resize = 0;
  courses._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  if (this->debugOn == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&this->beginDebugString);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Reader resourcepath: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->resourcesPath);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  getCoursesFromFile_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
              *)&required,this,&fin);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&courses._M_h,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&required);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&required);
  (*this->major->_vptr_AbstractMajor[1])(&local_3c0);
  local_3e8 = local_3c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_3f0 = &__cxxabiv1::__class_type_info::vtable;
  while( true ) {
    if (local_3c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == local_3e8) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3c0);
      if (this->debugOn != false) {
        poVar2 = std::operator<<((ostream *)&std::cout,(string *)&this->endDebugString);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&courses._M_h);
      std::ifstream::~ifstream(&fin);
      return __return_storage_ptr__;
    }
    local_3e0 = local_3c0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string
              ((string *)&required,
               (string *)
               local_3c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cList = (vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *)operator_new(0x18);
    (cList->super__Vector_base<CourseComponent_*,_std::allocator<CourseComponent_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (cList->super__Vector_base<CourseComponent_*,_std::allocator<CourseComponent_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (cList->super__Vector_base<CourseComponent_*,_std::allocator<CourseComponent_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (this->debugOn == true) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Attempting to add ");
      poVar2 = std::operator<<(poVar2,(string *)&required);
      poVar2 = std::operator<<(poVar2," to heirarchy");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    ppCVar3 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&courses,&required);
    course = *ppCVar3;
    std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>::push_back(cList,&course);
    if (course == (CourseComponent *)0x0) break;
    plVar4 = (long *)__dynamic_cast(course,&CourseComponent::typeinfo,&Course::typeinfo,0);
    if (plVar4 == (long *)0x0) break;
    std::__cxx11::string::string((string *)&local_258,(string *)(plVar4 + 0xd));
    getPrereqs(&prereqs,this,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    pbVar1 = prereqs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = prereqs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1)
    {
      std::__cxx11::string::string((string *)&name,(string *)pbVar6);
      if (this->debugOn == true) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Adding ");
        poVar2 = std::operator<<(poVar2,(string *)&name);
        poVar2 = std::operator<<(poVar2," to prereqs of ");
        (**(code **)(*plVar4 + 0x18))(local_3a8,plVar4);
        poVar2 = std::operator<<(poVar2,local_3a8);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string(local_3a8);
      }
      ppCVar3 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&courses,&name);
      temp = *ppCVar3;
      std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>::push_back(cList,&temp);
      std::__cxx11::string::~string((string *)&name);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&prereqs);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<std::__cxx11::string&,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)__return_storage_ptr__,&required,&cList);
    std::__cxx11::string::~string((string *)&required);
    local_3c0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_3e0 + 1;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = local_3f0;
  __cxa_throw(puVar5,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

unordered_map<string, vector<CourseComponent*>*> createCourseHeirarchy() const {
			ifstream fin(resourcesPath + resourceExtension);
			unordered_map<string, CourseComponent*> courses;
			unordered_map<string, vector<CourseComponent*>*> heirarchy;
			
			if (debugOn) {
				cout << beginDebugString << endl;
				cout << "Reader resourcepath: " << resourcesPath << endl;
			}
			
			courses = getCoursesFromFile(fin);

			for (auto required : major->getRequiredCourses()) {
				vector<CourseComponent*>* cList = new vector<CourseComponent*>();
				if (debugOn) {
					cout << "Attempting to add " << required << " to heirarchy" << endl;
				}
				CourseComponent* course;
				try { // if course cannot be found initially, just make it a prereq
					course = courses.at(required);
				} catch (out_of_range& e) {
					course = new Prerequisite(required, 4, "");
				}
				// push it to the list

				cList->push_back(course);
				try {
					// attempt to cast it to course to see if it has prerequisites;
					Course* courseCast = dynamic_cast<Course*>(course);
					if (courseCast == nullptr) {
						throw bad_cast(); // throw bad cast to get caught so that it can be a prereq type
					}

					// if it passed, get the prereqs in a vector
					vector<string> prereqs = getPrereqs(courseCast->getCourseRequisites());
					// loop through them and see if we can find them in the courses;
					for (auto name : prereqs) {
						if (debugOn) {
							cout << "Adding " << name << " to prereqs of " << courseCast->getCourseName() << endl;
						}
						CourseComponent* temp;
						try {
							temp = courses.at(name); // check if it exists;
						}
						catch (out_of_range& e) {
							// if it doesnt exist, just say we're unable to retrieve and construct a new one;
							temp = new Course(name, 4, "Unable to Retreive", "Unable to Retreive");
							if (debugOn) {
								cout << temp->getCourseName() << " is being added as a constructed prereq" << endl;
							}
						}
						// push it to the cList;
						cList->push_back(temp);
					}
				} catch (bad_cast& e) {
					if (debugOn) {
						cout << "NOT A COURSE, SIMPLY ADDING AS PREREQUISITE" << endl;
					}
				}
				heirarchy.emplace(required, cList);
			}

			if (debugOn) {
				cout << endDebugString << endl;
			}

			return heirarchy;
		}